

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O0

void __thiscall flowtest::Lexer::skipSpace(Lexer *this)

{
  int iVar1;
  Lexer *this_local;
  
  while ((iVar1 = currentChar(this), iVar1 == 9 || (iVar1 == 0x20))) {
    nextChar(this,1);
  }
  return;
}

Assistant:

void Lexer::skipSpace() {
  for (;;) {
    switch (currentChar()) {
      case ' ':
      case '\t':
        nextChar();
        break;
      default:
        return;
    }
  }
}